

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  byte bVar1;
  long lVar2;
  CodeHolder *self;
  ulong uVar3;
  uint64_t uVar4;
  uint8_t *puVar5;
  byte bVar6;
  Error EVar7;
  Section *pSVar8;
  Section *pSVar9;
  AddressTableEntry *pAVar10;
  long lVar11;
  Section **ppSVar12;
  uint8_t uVar13;
  uint32_t uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint64_t value;
  Compare<0U> local_89;
  Value local_88;
  Section *local_80;
  uint64_t local_78;
  CodeHolder *local_70;
  uint8_t *local_68;
  uint64_t local_60;
  ulong local_58;
  ZoneTree<asmjit::AddressTableEntry> *local_50;
  void *local_48;
  long local_40;
  CodeHolder *local_38;
  
  if (baseAddress == 0xffffffffffffffff) {
    EVar7 = 2;
  }
  else {
    this->_baseAddress = baseAddress;
    bVar1 = (this->_environment)._arch;
    pSVar8 = this->_addressTableSection;
    if (pSVar8 == (Section *)0x0) {
      local_68 = (uint8_t *)0x0;
    }
    else {
      EVar7 = reserveBuffer(this,&pSVar8->_buffer,pSVar8->_virtualSize);
      if (EVar7 != 0) {
        return EVar7;
      }
      local_68 = (pSVar8->_buffer)._data;
    }
    local_88.constant = 0;
    bVar6 = bVar1 & 1;
    local_48 = (this->_relocations).super_ZoneVectorBase._data;
    local_50 = &this->_addressTableEntries;
    local_58 = (ulong)bVar6 ^ 3;
    local_40 = (ulong)(this->_relocations).super_ZoneVectorBase._size << 3;
    local_80 = pSVar8;
    local_78 = baseAddress;
    local_70 = this;
    for (lVar17 = 0; local_40 != lVar17; lVar17 = lVar17 + 8) {
      lVar2 = *(long *)((long)local_48 + lVar17);
      if (*(int *)(lVar2 + 4) != 0) {
        pSVar8 = sectionById(this,*(uint32_t *)(lVar2 + 0x10));
        if (*(uint32_t *)(lVar2 + 0x14) == 0xffffffff) {
          pSVar9 = (Section *)0x0;
        }
        else {
          pSVar9 = sectionById(this,*(uint32_t *)(lVar2 + 0x14));
        }
        self = *(CodeHolder **)(lVar2 + 0x20);
        uVar15 = (pSVar8->_buffer)._size;
        uVar3 = *(ulong *)(lVar2 + 0x18);
        if (((uVar15 <= uVar3) || (uVar16 = (ulong)*(byte *)(lVar2 + 10), uVar15 - uVar3 < uVar16))
           || (4 < *(int *)(lVar2 + 4) - 1U)) {
LAB_0010fea4:
          return 0x18;
        }
        uVar4 = pSVar8->_offset;
        puVar5 = (pSVar8->_buffer)._data;
        uVar15 = *(byte *)(lVar2 + 0xc) + uVar3;
        value = (uint64_t)self;
        switch(*(int *)(lVar2 + 4)) {
        case 1:
          EVar7 = CodeHolder_evaluateExpression
                            (self,(Expression *)&value,
                             (uint64_t *)&switchD_0010fcc5::switchdataD_00135150);
          if (EVar7 != 0) {
            return EVar7;
          }
          break;
        case 3:
          if (pSVar9 == (Section *)0x0) {
            return 0x18;
          }
          value = (long)(self->_allocator)._slots + pSVar9->_offset + local_78 + -0x48;
          break;
        case 4:
          value = (long)self - (uVar3 + uVar16 + uVar4 + local_78);
          if (((bVar1 & 1) == 0) && (value + 0x80000000 >> 0x20 != 0)) {
            return 0x19;
          }
          break;
        case 5:
          if (uVar15 < 2) {
            return 0x18;
          }
          if (*(char *)(lVar2 + 0xb) != '\x04') {
            return 0x18;
          }
          value = (long)self - (uVar3 + uVar16 + local_78 + uVar4);
          if ((long)(int)value != value) {
            local_60 = uVar4;
            local_38 = self;
            pAVar10 = ZoneTree<asmjit::AddressTableEntry>::
                      get<unsigned_long,asmjit::Support::Compare<0u>>
                                (local_50,(unsigned_long *)&local_38,&local_89);
            if (pAVar10 == (AddressTableEntry *)0x0) {
              return 0x18;
            }
            if (local_80 == (Section *)0x0) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/codeholder.cpp"
                         ,0x3d8,"addressTableSection != nullptr");
            }
            uVar14 = pAVar10->_slot;
            if (uVar14 == 0xffffffff) {
              uVar14 = (uint32_t)local_88.constant;
              pAVar10->_slot = uVar14;
              local_88._0_4_ = uVar14 + 1;
              local_88.constant._4_4_ = 0;
            }
            lVar11 = (ulong)uVar14 << ((byte)local_58 & 0x3f);
            value = (local_80->_offset - (uVar3 + local_60 + uVar16)) + lVar11;
            if ((long)(int)value != value) {
              return 0x19;
            }
            uVar13 = '\x15';
            if (puVar5[uVar15 - 1] != 0xe8) {
              if (puVar5[uVar15 - 1] != 0xe9) {
                return 0x18;
              }
              uVar13 = '%';
            }
            puVar5[uVar15 - 2] = 0xff;
            puVar5[uVar15 - 1] = uVar13;
            *(undefined8 *)(local_68 + lVar11) = *(undefined8 *)(lVar2 + 0x20);
          }
        }
        this = local_70;
        switch(*(undefined1 *)(lVar2 + 0xb)) {
        case 1:
          puVar5[uVar15] = (uint8_t)value;
          break;
        case 2:
          *(undefined2 *)(puVar5 + uVar15) = (undefined2)value;
          break;
        default:
          goto LAB_0010fea4;
        case 4:
          *(undefined4 *)(puVar5 + uVar15) = (undefined4)value;
          break;
        case 8:
          *(uint64_t *)(puVar5 + uVar15) = value;
        }
      }
    }
    ppSVar12 = ZoneVector<asmjit::Section_*>::last(&this->_sectionsByOrder);
    EVar7 = 0;
    if (*ppSVar12 == local_80) {
      uVar15 = (ulong)(uint)((int)local_88.constant << (bVar6 ^ 3));
      (local_80->_buffer)._size = uVar15;
      local_80->_virtualSize = uVar15;
    }
  }
  return EVar7;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocEntry::kTypeNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();
    size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();

    switch (re->relocType()) {
      case RelocEntry::kTypeExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocEntry::kTypeAbsToAbs: {
        break;
      }

      case RelocEntry::kTypeRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocEntry::kTypeAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (addressSize > 4 && !Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);
        break;
      }

      case RelocEntry::kTypeX64AddressEntry: {
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    switch (re->format().valueSize()) {
      case 1:
        Support::writeU8(buffer + valueOffset, uint32_t(value & 0xFFu));
        break;

      case 2:
        Support::writeU16uLE(buffer + valueOffset, uint32_t(value & 0xFFFFu));
        break;

      case 4:
        Support::writeU32uLE(buffer + valueOffset, uint32_t(value & 0xFFFFFFFFu));
        break;

      case 8:
        Support::writeU64uLE(buffer + valueOffset, value);
        break;

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}